

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptorProto::InitAsDefaultInstance(FileDescriptorProto *this)

{
  FileOptions *pFVar1;
  SourceCodeInfo *pSVar2;
  
  pFVar1 = FileOptions::default_instance();
  this->options_ = pFVar1;
  pSVar2 = SourceCodeInfo::default_instance();
  this->source_code_info_ = pSVar2;
  return;
}

Assistant:

void FileDescriptorProto::InitAsDefaultInstance() {
  options_ = const_cast< ::google::protobuf::FileOptions*>(&::google::protobuf::FileOptions::default_instance());
  source_code_info_ = const_cast< ::google::protobuf::SourceCodeInfo*>(&::google::protobuf::SourceCodeInfo::default_instance());
}